

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ed25519-donna-batchverify.h
# Opt level: O2

int ed25519_sign_open_batch(uchar **m,size_t *mlen,uchar **pk,uchar **RS,size_t num,int *valid)

{
  uchar **ppuVar1;
  bignum256modm_element_t *pbVar2;
  int iVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  undefined1 *puVar7;
  undefined8 *puVar8;
  ulong uVar9;
  bignum256modm *pabVar10;
  bignum256modm_element_t bVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  size_t sVar22;
  uint num_00;
  uint uVar23;
  bignum256modm *pabVar24;
  ge25519 *pgVar25;
  ulong uVar26;
  heap_index_t hVar27;
  size_t sVar28;
  long lVar29;
  bool bVar30;
  uchar **local_72b8;
  uchar **local_72b0;
  uchar **local_72a8;
  size_t *local_72a0;
  heap_index_t local_7268;
  ulong local_7260;
  heap_index_t max1;
  undefined1 auStack_7250 [24];
  uchar local_7238 [8];
  undefined8 uStack_7230;
  uchar local_7228 [8];
  uchar auStack_7220 [8];
  undefined1 local_7218 [32];
  ge25519 p;
  uchar hram [64];
  batch_heap batch;
  
  for (sVar4 = 0; num != sVar4; sVar4 = sVar4 + 1) {
    valid[sVar4] = 1;
  }
  uVar23 = 0;
  local_72b8 = pk;
  local_72b0 = RS;
  local_72a8 = m;
  local_72a0 = mlen;
  do {
    if (num < 4) {
      for (uVar9 = 0; num != uVar9; uVar9 = uVar9 + 1) {
        iVar3 = ed25519_sign_open(local_72a8[uVar9],local_72a0[uVar9],local_72b8[uVar9],
                                  local_72b0[uVar9]);
        valid[uVar9] = (uint)(iVar3 == 0);
        uVar23 = uVar23 | iVar3 == 0 ^ 1;
      }
      return uVar23;
    }
    uVar9 = 0x40;
    if (num < 0x40) {
      uVar9 = num;
    }
    num_00 = (int)uVar9 << 4;
    RAND_bytes((uchar *)&batch,num_00);
    pabVar10 = batch.scalars + uVar9 + 1;
    for (uVar26 = 0; num_00 != uVar26; uVar26 = uVar26 + 0x10) {
      expand256_modm(*pabVar10,batch.r[0] + uVar26,0x10);
      pabVar10 = pabVar10 + 1;
    }
    pabVar10 = batch.scalars;
    pabVar24 = pabVar10;
    for (uVar26 = 0; uVar9 != uVar26; uVar26 = uVar26 + 1) {
      expand256_modm(*pabVar24,local_72b0[uVar26] + 0x20,0x20);
      mul256_modm(*pabVar24,*pabVar24,pabVar24[uVar9 + 1]);
      pabVar24 = pabVar24 + 1;
    }
    pabVar24 = batch.scalars;
    uVar26 = uVar9;
    while (pabVar24 = pabVar24 + 1, uVar26 = uVar26 - 1, uVar26 != 0) {
      add256_modm(*pabVar10,*pabVar10,*pabVar24);
    }
    pabVar10 = batch.scalars;
    for (uVar26 = 0; pabVar10 = pabVar10 + 1, uVar9 != uVar26; uVar26 = uVar26 + 1) {
      ed25519_hram(hram,local_72b0[uVar26],local_72b8[uVar26],local_72a8[uVar26],local_72a0[uVar26])
      ;
      expand256_modm(*pabVar10,hram,0x40);
      mul256_modm(*pabVar10,*pabVar10,pabVar10[uVar9]);
    }
    memcpy(batch.points,&ge25519_basepoint,0xa0);
    pgVar25 = batch.points;
    uVar26 = 0;
    do {
      pgVar25 = pgVar25 + 1;
      if (uVar9 == uVar26) {
        pgVar25 = batch.points + uVar9 + 1;
        uVar26 = 0;
        goto LAB_00235d7a;
      }
      ppuVar1 = local_72b8 + uVar26;
      uVar26 = uVar26 + 1;
      iVar3 = ge25519_unpack_negative_vartime(pgVar25,*ppuVar1);
    } while (iVar3 != 0);
LAB_002368b4:
    for (uVar26 = 0; uVar9 != uVar26; uVar26 = uVar26 + 1) {
      iVar3 = ed25519_sign_open(local_72a8[uVar26],local_72a0[uVar26],local_72b8[uVar26],
                                local_72b0[uVar26]);
      valid[uVar26] = (uint)(iVar3 == 0);
      uVar23 = uVar23 | iVar3 == 0 ^ 1;
    }
LAB_002368fe:
    local_72a8 = local_72a8 + uVar9;
    local_72a0 = local_72a0 + uVar9;
    local_72b8 = local_72b8 + uVar9;
    local_72b0 = local_72b0 + uVar9;
    num = num - uVar9;
    valid = valid + uVar9;
  } while( true );
LAB_00235d7a:
  if (uVar9 != uVar26) goto code_r0x00235d7f;
  batch.heap[0] = 0;
  batch.size = 0;
  while (batch.size < (uVar9 + 1 | 1)) {
    heap_insert_next(&batch);
  }
  local_7260 = uVar9 * 2;
  bVar30 = false;
  sVar4 = 4;
LAB_00235e00:
  heap_get_top2(&batch,&max1,&local_7268,sVar4);
  hVar27 = local_7268;
  iVar3 = iszero256_modm_batch(batch.scalars[local_7268]);
  uVar26 = local_7260;
  if (iVar3 == 0) {
    sVar4 = sVar4 - (batch.scalars[max1][sVar4] == 0);
    if (bVar30) {
LAB_00235e4b:
      bVar30 = true;
    }
    else {
      bVar30 = false;
      if ((batch.scalars[max1][2] & 0xffffffffff0000) == 0 &&
          (batch.scalars[max1][3] == 0 && batch.scalars[max1][4] == 0)) {
        while (batch.size <= uVar26) {
          heap_insert_next(&batch);
        }
        heap_get_top2(&batch,&max1,&local_7268,sVar4);
        hVar27 = local_7268;
        goto LAB_00235e4b;
      }
    }
    pabVar10 = batch.scalars + max1;
    pabVar24 = batch.scalars + hVar27;
    iVar3 = 0;
    lVar17 = 0;
    iVar13 = 0;
    lVar29 = 0;
    iVar15 = 0;
    lVar18 = 0;
    switch(sVar4) {
    case 4:
      uVar26 = (*pabVar10)[0] - (*pabVar24)[0];
      lVar17 = (long)uVar26 >> 0x3f;
      (*pabVar10)[0] = uVar26 & 0xffffffffffffff;
      iVar3 = 1;
    case 3:
      uVar26 = (ulong)(uint)(iVar3 * 8);
      uVar5 = (*(long *)((long)*pabVar10 + uVar26) - *(long *)((long)*pabVar24 + uVar26)) + lVar17;
      lVar29 = (long)uVar5 >> 0x3f;
      *(ulong *)((long)*pabVar10 + uVar26) = uVar5 & 0xffffffffffffff;
      iVar13 = iVar3 + 1;
    case 2:
      uVar26 = (ulong)(uint)(iVar13 * 8);
      uVar5 = (*(long *)((long)*pabVar10 + uVar26) - *(long *)((long)*pabVar24 + uVar26)) + lVar29;
      lVar18 = (long)uVar5 >> 0x3f;
      *(ulong *)((long)*pabVar10 + uVar26) = uVar5 & 0xffffffffffffff;
      iVar15 = iVar13 + 1;
    case 1:
      uVar26 = (ulong)(uint)(iVar15 * 8);
      uVar5 = (*(long *)((long)*pabVar10 + uVar26) - *(long *)((long)*pabVar24 + uVar26)) + lVar18;
      lVar17 = (long)uVar5 >> 0x3f;
      *(ulong *)((long)*pabVar10 + uVar26) = uVar5 & 0xffffffffffffff;
      iVar15 = iVar15 + 1;
      break;
    default:
      iVar15 = 0;
      lVar17 = 0;
    }
    uVar26 = (ulong)(uint)(iVar15 << 3);
    *(long *)((long)*pabVar10 + uVar26) =
         (lVar17 + *(long *)((long)*pabVar10 + uVar26)) - *(long *)((long)*pabVar24 + uVar26);
    ge25519_add(batch.points + hVar27,batch.points + hVar27,batch.points + max1);
    uVar6 = 1;
    uVar5 = 2;
    uVar12 = 0;
    uVar26 = uVar6;
    while (uVar5 < batch.size) {
      iVar3 = lt256_modm_batch(batch.scalars[batch.heap[uVar26]],batch.scalars[batch.heap[uVar5]],
                               sVar4);
      uVar6 = uVar26;
      if (iVar3 != 0) {
        uVar6 = uVar5;
      }
      hVar27 = batch.heap[uVar12];
      batch.heap[uVar12] = batch.heap[uVar6];
      batch.heap[uVar6] = hVar27;
      uVar26 = uVar6 * 2 + 1;
      uVar12 = uVar6;
      uVar5 = uVar6 * 2 + 2;
    }
    while( true ) {
      uVar26 = uVar6 - 1 >> 1;
      if (uVar6 == 0) break;
      hVar27 = batch.heap[uVar26];
      if (sVar4 < 5) {
        pabVar10 = batch.scalars + hVar27;
        pabVar24 = batch.scalars + batch.heap[uVar6];
        lVar17 = 0;
        lVar29 = 0;
        lVar20 = 0;
        lVar18 = 0;
        lVar21 = 0;
        sVar22 = sVar4;
        sVar28 = sVar4;
        switch(sVar4) {
        case 4:
          lVar29 = (long)((*pabVar24)[0] - (*pabVar10)[0]) >> 0x3f;
          lVar17 = 1;
        case 3:
          uVar5 = (ulong)(uint)((int)lVar17 * 8);
          lVar18 = (lVar29 + *(long *)((long)*pabVar24 + uVar5)) -
                   *(long *)((long)*pabVar10 + uVar5) >> 0x3f;
          lVar20 = lVar17 + 1;
        case 2:
          uVar5 = (ulong)(uint)((int)lVar20 * 8);
          lVar18 = (lVar18 + *(long *)((long)*pabVar24 + uVar5)) -
                   *(long *)((long)*pabVar10 + uVar5) >> 0x3f;
          lVar21 = lVar20 + 1;
        case 1:
          uVar5 = (ulong)(uint)((int)lVar21 * 8);
          sVar22 = (lVar18 + *(long *)((long)*pabVar24 + uVar5)) -
                   *(long *)((long)*pabVar10 + uVar5) >> 0x3f;
          sVar28 = lVar21 + 1;
        }
        if ((long)((sVar22 + (*pabVar24)[sVar28]) - (*pabVar10)[sVar28]) < 0) break;
      }
      batch.heap[uVar26] = batch.heap[uVar6];
      batch.heap[uVar6] = hVar27;
      uVar6 = uVar26;
    }
    goto LAB_00235e00;
  }
  pgVar25 = batch.points + max1;
  lVar29 = max1 * 0x28;
  pabVar10 = batch.scalars + max1;
  lVar17 = 0;
  do {
    if (lVar17 == 5) {
      memcpy(&p,pgVar25,0xa0);
      goto LAB_0023624c;
    }
    bVar30 = lVar17 == 0;
    pbVar2 = *pabVar10 + lVar17;
    lVar17 = lVar17 + 1;
  } while (*pbVar2 == (ulong)bVar30);
  iVar3 = iszero256_modm_batch(*pabVar10);
  if (iVar3 == 0) {
    memcpy(&p,pgVar25,0xa0);
    lVar17 = 0xb19;
    do {
      lVar18 = lVar17;
      bVar11 = *(ulong *)((long)batch.r + lVar18 * 8 + lVar29);
      lVar17 = lVar18 + -1;
    } while (bVar11 == 0);
    lVar18 = lVar18 + -0xb16;
    uVar26 = 0x80000000000000;
    do {
      uVar5 = uVar26;
      uVar26 = uVar5 >> 1;
    } while ((uVar5 & bVar11) == 0);
    while( true ) {
      do {
        ge25519_double(&p,&p);
        if ((bVar11 & uVar5) != 0) {
          ge25519_add(&p,&p,pgVar25);
        }
        bVar30 = 1 < uVar5;
        uVar5 = uVar5 >> 1;
      } while (bVar30);
      if (lVar18 == 0) break;
      bVar11 = *(uint64_t *)((long)(pabVar10 + -1) + (lVar18 + 4) * 8);
      uVar5 = 0x80000000000000;
      lVar18 = lVar18 + -1;
    }
  }
  else {
    memset(&p,0,0xa0);
    p.y[0] = 1;
    p.z[0] = 1;
  }
LAB_0023624c:
  uVar26 = (p.x[0] >> 0x33) + p.x[1];
  uVar5 = (uVar26 >> 0x33) + p.x[2];
  uVar6 = (uVar5 >> 0x33) + p.x[3];
  uVar12 = (uVar6 >> 0x33) + p.x[4];
  uVar14 = (uVar12 >> 0x33) * 0x13 + (p.x[0] & 0x7ffffffffffff);
  uVar16 = (uVar14 >> 0x33) + (uVar26 & 0x7ffffffffffff);
  uVar26 = (uVar16 >> 0x33) + (uVar5 & 0x7ffffffffffff);
  uVar19 = (uVar26 >> 0x33) + (uVar6 & 0x7ffffffffffff);
  uVar6 = (uVar19 >> 0x33) + (uVar12 & 0x7ffffffffffff);
  uVar12 = (uVar14 & 0x7ffffffffffff) + (uVar6 >> 0x33) * 0x13 + 0x13;
  uVar5 = (uVar12 >> 0x33) + (uVar16 & 0x7ffffffffffff);
  uVar14 = (uVar5 >> 0x33) + (uVar26 & 0x7ffffffffffff);
  uVar16 = (uVar14 >> 0x33) + (uVar19 & 0x7ffffffffffff);
  uVar26 = (uVar16 >> 0x33) + (uVar6 & 0x7ffffffffffff);
  uVar19 = (uVar26 >> 0x33) * 0x13 + (uVar12 & 0x7ffffffffffff) + 0x7ffffffffffed;
  uVar6 = (uVar19 >> 0x33) + (uVar5 & 0x7ffffffffffff) + 0x7ffffffffffff;
  uVar12 = (uVar6 >> 0x33) + (uVar14 & 0x7ffffffffffff) + 0x7ffffffffffff;
  uVar5 = (uVar12 >> 0x33) + (uVar16 & 0x7ffffffffffff) + 0x7ffffffffffff;
  uVar14 = uVar6 << 0x33 | uVar19 & 0x7ffffffffffff;
  lVar17 = 0x20;
  for (lVar29 = 0; lVar29 != 8; lVar29 = lVar29 + 1) {
    auStack_7250[lVar29 + -8] = (char)uVar14;
    uVar14 = uVar14 >> 8;
  }
  uVar6 = uVar12 << 0x26 | uVar6 >> 0xd & 0x3fffffffff;
  puVar7 = auStack_7250;
  lVar29 = 8;
  lVar18 = 0x40;
  while (bVar30 = lVar29 != 0, lVar29 = lVar29 + -1, bVar30) {
    *puVar7 = (char)uVar6;
    puVar7 = puVar7 + 1;
    uVar6 = uVar6 >> 8;
  }
  uVar6 = uVar5 * 0x2000000 | (ulong)((uint)(uVar12 >> 0x1a) & 0x1ffffff);
  for (lVar29 = 0; lVar29 != 8; lVar29 = lVar29 + 1) {
    puVar7[lVar29] = (char)uVar6;
    uVar6 = uVar6 >> 8;
  }
  uVar26 = (uVar26 + 0x7ffffffffffff + (uVar5 >> 0x33)) * 0x1000 & 0x7ffffffffffff000 |
           (ulong)((uint)(uVar5 >> 0x27) & 0xfff);
  puVar7 = puVar7 + 8;
  lVar29 = 8;
  while (bVar30 = lVar29 != 0, lVar29 = lVar29 + -1, bVar30) {
    *puVar7 = (char)uVar26;
    puVar7 = puVar7 + 1;
    uVar26 = uVar26 >> 8;
  }
  uVar26 = (p.y[0] >> 0x33) + p.y[1];
  uVar5 = (uVar26 >> 0x33) + p.y[2];
  uVar6 = (uVar5 >> 0x33) + p.y[3];
  uVar12 = (uVar6 >> 0x33) + p.y[4];
  uVar14 = (uVar12 >> 0x33) * 0x13 + (p.y[0] & 0x7ffffffffffff);
  uVar16 = (uVar14 >> 0x33) + (uVar26 & 0x7ffffffffffff);
  uVar26 = (uVar16 >> 0x33) + (uVar5 & 0x7ffffffffffff);
  uVar6 = (uVar26 >> 0x33) + (uVar6 & 0x7ffffffffffff);
  uVar5 = (uVar6 >> 0x33) + (uVar12 & 0x7ffffffffffff);
  uVar26 = (uVar14 & 0x7ffffffffffff) + (uVar5 >> 0x33) * 0x13 + 0x13;
  uVar26 = (uVar26 >> 0x33) + (uVar16 & 0x7ffffffffffff);
  uVar26 = (uVar26 >> 0x33) + (uVar26 & 0x7ffffffffffff);
  uVar26 = (uVar26 >> 0x33) + (uVar6 & 0x7ffffffffffff);
  uVar26 = (uVar26 >> 0x33) + (uVar5 & 0x7ffffffffffff);
  uVar26 = (uVar26 >> 0x33) * 0x13 + (uVar26 & 0x7ffffffffffff) + 0x7ffffffffffed;
  uVar6 = (uVar26 >> 0x33) + (uVar26 & 0x7ffffffffffff) + 0x7ffffffffffff;
  uVar12 = (uVar6 >> 0x33) + (uVar26 & 0x7ffffffffffff) + 0x7ffffffffffff;
  uVar5 = (uVar12 >> 0x33) + (uVar26 & 0x7ffffffffffff) + 0x7ffffffffffff;
  uVar14 = uVar6 << 0x33 | uVar26 & 0x7ffffffffffff;
  for (; lVar17 != 0x28; lVar17 = lVar17 + 1) {
    auStack_7250[lVar17 + -8] = (char)uVar14;
    uVar14 = uVar14 >> 8;
  }
  uVar6 = uVar12 << 0x26 | uVar6 >> 0xd & 0x3fffffffff;
  puVar8 = &uStack_7230;
  lVar17 = 8;
  while (bVar30 = lVar17 != 0, lVar17 = lVar17 + -1, bVar30) {
    *(char *)puVar8 = (char)uVar6;
    puVar8 = (undefined8 *)((long)puVar8 + 1);
    uVar6 = uVar6 >> 8;
  }
  uVar6 = uVar5 * 0x2000000 | (ulong)((uint)(uVar12 >> 0x1a) & 0x1ffffff);
  for (lVar17 = 0; lVar17 != 8; lVar17 = lVar17 + 1) {
    *(char *)((long)puVar8 + lVar17) = (char)uVar6;
    uVar6 = uVar6 >> 8;
  }
  uVar26 = (uVar26 + 0x7ffffffffffff + (uVar5 >> 0x33)) * 0x1000 & 0x7ffffffffffff000 |
           (ulong)((uint)(uVar5 >> 0x27) & 0xfff);
  puVar8 = puVar8 + 1;
  lVar17 = 8;
  while (bVar30 = lVar17 != 0, lVar17 = lVar17 + -1, bVar30) {
    *(char *)puVar8 = (char)uVar26;
    puVar8 = (undefined8 *)((long)puVar8 + 1);
    uVar26 = uVar26 >> 8;
  }
  uVar26 = (p.z[0] >> 0x33) + p.z[1];
  uVar5 = (uVar26 >> 0x33) + p.z[2];
  uVar6 = (uVar5 >> 0x33) + p.z[3];
  uVar12 = (uVar6 >> 0x33) + p.z[4];
  uVar14 = (uVar12 >> 0x33) * 0x13 + (p.z[0] & 0x7ffffffffffff);
  uVar16 = (uVar14 >> 0x33) + (uVar26 & 0x7ffffffffffff);
  uVar26 = (uVar16 >> 0x33) + (uVar5 & 0x7ffffffffffff);
  uVar6 = (uVar26 >> 0x33) + (uVar6 & 0x7ffffffffffff);
  uVar5 = (uVar6 >> 0x33) + (uVar12 & 0x7ffffffffffff);
  uVar26 = (uVar14 & 0x7ffffffffffff) + (uVar5 >> 0x33) * 0x13 + 0x13;
  uVar26 = (uVar26 >> 0x33) + (uVar16 & 0x7ffffffffffff);
  uVar26 = (uVar26 >> 0x33) + (uVar26 & 0x7ffffffffffff);
  uVar26 = (uVar26 >> 0x33) + (uVar6 & 0x7ffffffffffff);
  uVar26 = (uVar26 >> 0x33) + (uVar5 & 0x7ffffffffffff);
  uVar26 = (uVar26 >> 0x33) * 0x13 + (uVar26 & 0x7ffffffffffff) + 0x7ffffffffffed;
  uVar6 = (uVar26 >> 0x33) + (uVar26 & 0x7ffffffffffff) + 0x7ffffffffffff;
  uVar12 = (uVar6 >> 0x33) + (uVar26 & 0x7ffffffffffff) + 0x7ffffffffffff;
  uVar5 = (uVar12 >> 0x33) + (uVar26 & 0x7ffffffffffff) + 0x7ffffffffffff;
  uVar14 = uVar6 << 0x33 | uVar26 & 0x7ffffffffffff;
  for (; lVar18 != 0x48; lVar18 = lVar18 + 1) {
    auStack_7250[lVar18 + -8] = (char)uVar14;
    uVar14 = uVar14 >> 8;
  }
  uVar6 = uVar12 << 0x26 | uVar6 >> 0xd & 0x3fffffffff;
  puVar7 = local_7218 + 8;
  lVar17 = 8;
  while (bVar30 = lVar17 != 0, lVar17 = lVar17 + -1, bVar30) {
    *puVar7 = (char)uVar6;
    puVar7 = puVar7 + 1;
    uVar6 = uVar6 >> 8;
  }
  uVar6 = uVar5 * 0x2000000 | (ulong)((uint)(uVar12 >> 0x1a) & 0x1ffffff);
  for (lVar17 = 0; lVar17 != 8; lVar17 = lVar17 + 1) {
    puVar7[lVar17] = (char)uVar6;
    uVar6 = uVar6 >> 8;
  }
  uVar26 = (uVar26 + 0x7ffffffffffff + (uVar5 >> 0x33)) * 0x1000 & 0x7ffffffffffff000 |
           (ulong)((uint)(uVar5 >> 0x27) & 0xfff);
  puVar7 = puVar7 + 8;
  lVar17 = 8;
  while (bVar30 = lVar17 != 0, lVar17 = lVar17 + -1, bVar30) {
    *puVar7 = (char)uVar26;
    puVar7 = puVar7 + 1;
    uVar26 = uVar26 >> 8;
  }
  batch_point_buffer[1][0x10] = local_7228[0];
  batch_point_buffer[1][0x11] = local_7228[1];
  batch_point_buffer[1][0x12] = local_7228[2];
  batch_point_buffer[1][0x13] = local_7228[3];
  batch_point_buffer[1][0x14] = local_7228[4];
  batch_point_buffer[1][0x15] = local_7228[5];
  batch_point_buffer[1][0x16] = local_7228[6];
  batch_point_buffer[1][0x17] = local_7228[7];
  batch_point_buffer[1][0x18] = auStack_7220[0];
  batch_point_buffer[1][0x19] = auStack_7220[1];
  batch_point_buffer[1][0x1a] = auStack_7220[2];
  batch_point_buffer[1][0x1b] = auStack_7220[3];
  batch_point_buffer[1][0x1c] = auStack_7220[4];
  batch_point_buffer[1][0x1d] = auStack_7220[5];
  batch_point_buffer[1][0x1e] = auStack_7220[6];
  batch_point_buffer[1][0x1f] = auStack_7220[7];
  batch_point_buffer[1][0] = local_7238[0];
  batch_point_buffer[1][1] = local_7238[1];
  batch_point_buffer[1][2] = local_7238[2];
  batch_point_buffer[1][3] = local_7238[3];
  batch_point_buffer[1][4] = local_7238[4];
  batch_point_buffer[1][5] = local_7238[5];
  batch_point_buffer[1][6] = local_7238[6];
  batch_point_buffer[1][7] = local_7238[7];
  batch_point_buffer[1][8] = (uchar)uStack_7230;
  batch_point_buffer[1][9] = uStack_7230._1_1_;
  batch_point_buffer[1][10] = uStack_7230._2_1_;
  batch_point_buffer[1][0xb] = uStack_7230._3_1_;
  batch_point_buffer[1][0xc] = uStack_7230._4_1_;
  batch_point_buffer[1][0xd] = uStack_7230._5_1_;
  batch_point_buffer[1][0xe] = uStack_7230._6_1_;
  batch_point_buffer[1][0xf] = uStack_7230._7_1_;
  iVar3 = bcmp(&max1,ge25519_is_neutral_vartime_zero,0x20);
  if ((iVar3 != 0) || (iVar3 = bcmp(local_7238,local_7218,0x20), iVar3 != 0)) {
    uVar23 = uVar23 | 2;
    goto LAB_002368b4;
  }
  goto LAB_002368fe;
code_r0x00235d7f:
  iVar3 = ge25519_unpack_negative_vartime(pgVar25,local_72b0[uVar26]);
  uVar26 = uVar26 + 1;
  pgVar25 = pgVar25 + 1;
  if (iVar3 == 0) goto LAB_002368b4;
  goto LAB_00235d7a;
}

Assistant:

int
ED25519_FN(ed25519_sign_open_batch) (const unsigned char **m, size_t *mlen, const unsigned char **pk, const unsigned char **RS, size_t num, int *valid) {
	batch_heap ALIGN(16) batch;
	ge25519 ALIGN(16) p;
	bignum256modm *r_scalars;
	size_t i, batchsize;
	unsigned char hram[64];
	int ret = 0;

	for (i = 0; i < num; i++)
		valid[i] = 1;

	while (num > 3) {
		batchsize = (num > max_batch_size) ? max_batch_size : num;

		/* generate r (scalars[batchsize+1]..scalars[2*batchsize] */
		ED25519_FN(ed25519_randombytes_unsafe) (batch.r, batchsize * 16);
		r_scalars = &batch.scalars[batchsize + 1];
		for (i = 0; i < batchsize; i++)
			expand256_modm(r_scalars[i], batch.r[i], 16);

		/* compute scalars[0] = ((r1s1 + r2s2 + ...)) */
		for (i = 0; i < batchsize; i++) {
			expand256_modm(batch.scalars[i], RS[i] + 32, 32);
			mul256_modm(batch.scalars[i], batch.scalars[i], r_scalars[i]);
		}
		for (i = 1; i < batchsize; i++)
			add256_modm(batch.scalars[0], batch.scalars[0], batch.scalars[i]);

		/* compute scalars[1]..scalars[batchsize] as r[i]*H(R[i],A[i],m[i]) */
		for (i = 0; i < batchsize; i++) {
			ed25519_hram(hram, RS[i], pk[i], m[i], mlen[i]);
			expand256_modm(batch.scalars[i+1], hram, 64);
			mul256_modm(batch.scalars[i+1], batch.scalars[i+1], r_scalars[i]);
		}

		/* compute points */
		batch.points[0] = ge25519_basepoint;
		for (i = 0; i < batchsize; i++)
			if (!ge25519_unpack_negative_vartime(&batch.points[i+1], pk[i]))
				goto fallback;
		for (i = 0; i < batchsize; i++)
			if (!ge25519_unpack_negative_vartime(&batch.points[batchsize+i+1], RS[i]))
				goto fallback;

		ge25519_multi_scalarmult_vartime(&p, &batch, (batchsize * 2) + 1);
		if (!ge25519_is_neutral_vartime(&p)) {
			ret |= 2;

			fallback:
			for (i = 0; i < batchsize; i++) {
				valid[i] = ED25519_FN(ed25519_sign_open) (m[i], mlen[i], pk[i], RS[i]) ? 0 : 1;
				ret |= (valid[i] ^ 1);
			}
		}

		m += batchsize;
		mlen += batchsize;
		pk += batchsize;
		RS += batchsize;
		num -= batchsize;
		valid += batchsize;
	}

	for (i = 0; i < num; i++) {
		valid[i] = ED25519_FN(ed25519_sign_open) (m[i], mlen[i], pk[i], RS[i]) ? 0 : 1;
		ret |= (valid[i] ^ 1);
	}

	return ret;
}